

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_7.cpp
# Opt level: O0

double __thiscall Symbol_table::get_value(Symbol_table *this,string *s)

{
  code *pcVar1;
  bool bVar2;
  __type _Var3;
  allocator<char> local_59;
  string local_58;
  reference local_38;
  Variable *var;
  iterator __end1;
  iterator __begin1;
  Vector<Variable> *__range1;
  string *s_local;
  Symbol_table *this_local;
  
  __end1 = std::vector<Variable,_std::allocator<Variable>_>::begin
                     ((vector<Variable,_std::allocator<Variable>_> *)this);
  var = (Variable *)
        std::vector<Variable,_std::allocator<Variable>_>::end
                  ((vector<Variable,_std::allocator<Variable>_> *)this);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Variable_*,_std::vector<Variable,_std::allocator<Variable>_>_>
                                *)&var);
    if (!bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"get: undefined name ",&local_59);
      error(&local_58,s);
      std::__cxx11::string::~string((string *)&local_58);
      std::allocator<char>::~allocator(&local_59);
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    local_38 = __gnu_cxx::
               __normal_iterator<Variable_*,_std::vector<Variable,_std::allocator<Variable>_>_>::
               operator*(&__end1);
    _Var3 = std::operator==(&local_38->name,s);
    if (_Var3) break;
    __gnu_cxx::__normal_iterator<Variable_*,_std::vector<Variable,_std::allocator<Variable>_>_>::
    operator++(&__end1);
  }
  return local_38->value;
}

Assistant:

double Symbol_table::get_value(const string& s)
{
	for (auto&& var : var_table)
		if (var.name == s)
			return var.value;
	error("get: undefined name ", s);
}